

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O2

SyntaxNode * __thiscall
slang::syntax::DeepCloneVisitor::visit<slang::syntax::OneStepDelaySyntax>
          (DeepCloneVisitor *this,OneStepDelaySyntax *node,BumpAllocator *alloc)

{
  OneStepDelaySyntax *pOVar1;
  Token local_38;
  Token local_28;
  
  local_28 = parsing::Token::deepClone(&node->hash,alloc);
  local_38 = parsing::Token::deepClone(&node->oneStep,alloc);
  pOVar1 = BumpAllocator::
           emplace<slang::syntax::OneStepDelaySyntax,slang::parsing::Token,slang::parsing::Token>
                     (alloc,&local_28,&local_38);
  return (SyntaxNode *)pOVar1;
}

Assistant:

SyntaxNode* visit(const T& node, BumpAllocator& alloc) {
        return deep::clone(node, alloc);
    }